

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QLayoutItem * __thiscall QDockAreaLayout::itemAt(QDockAreaLayout *this,int *x,int index)

{
  int iVar1;
  QLayoutItem *pQVar2;
  long lVar3;
  
  lVar3 = 0x40;
  while (lVar3 + 0x70 != 0x270) {
    pQVar2 = QDockAreaLayoutInfo::itemAt
                       ((QDockAreaLayoutInfo *)((long)this->corners + lVar3),x,index);
    lVar3 = lVar3 + 0x70;
    if (pQVar2 != (QLayoutItem *)0x0) {
      return pQVar2;
    }
  }
  if ((this->centralWidgetItem != (QLayoutItem *)0x0) &&
     (iVar1 = *x, *x = iVar1 + 1, iVar1 == index)) {
    return this->centralWidgetItem;
  }
  return (QLayoutItem *)0x0;
}

Assistant:

QLayoutItem *QDockAreaLayout::itemAt(int *x, int index) const
{
    Q_ASSERT(x != nullptr);

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        if (QLayoutItem *ret = dock.itemAt(x, index))
            return ret;
    }

    if (centralWidgetItem && (*x)++ == index)
        return centralWidgetItem;

    return nullptr;
}